

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O1

void predict_or_learn_active_cover<true>(active_cover *a,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  ulong uVar2;
  float prediction;
  float fVar3;
  float fVar4;
  vw *all;
  bool in_dis;
  uint64_t uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_a4;
  float local_98;
  
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  all = a->all;
  fVar15 = (float)all->sd->t;
  fVar17 = (ec->l).simple.label;
  prediction = (ec->pred).scalar;
  fVar3 = ec->weight;
  fVar9 = 1.0;
  fVar10 = 3.0;
  local_a4 = 1.0;
  if (3.0 <= fVar15) {
    fVar11 = a->active_c0;
    fVar16 = a->alpha;
    fVar9 = (((float)all->sd->sum_loss / fVar15) * fVar11) / fVar15;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    fVar16 = fVar16 + fVar16;
    if (fVar16 <= 4.0) {
      fVar16 = 4.0;
    }
    fVar10 = logf(fVar15);
    fVar9 = (fVar10 * fVar11 * fVar16) / fVar15 + fVar9;
  }
  in_dis = dis_test(all,ec,base,fVar10,fVar9);
  if (2.0 < fVar15) {
    fVar10 = ((float)all->sd->sum_loss / fVar15) * fVar15;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar11 = logf(fVar15);
    local_a4 = 1.0 / (fVar11 + fVar10);
    if (0.5 <= local_a4) {
      local_a4 = 0.5;
    }
  }
  fVar10 = query_decision(a,base,ec,prediction,local_a4,in_dis);
  if (in_dis) {
    if (fVar10 <= 0.0) {
      (ec->l).multi.label = 0x7f7fffff;
      ec->weight = 0.0;
      goto LAB_001de298;
    }
    all->sd->queries = all->sd->queries + 1;
    ec->weight = fVar3 * fVar10;
    (ec->l).simple.label = fVar17;
  }
  else {
    (ec->l).simple.label = *(float *)(&DAT_0027a638 + (ulong)(0.0 < prediction) * 4);
    ec->weight = fVar3;
  }
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
LAB_001de298:
  fVar9 = (((fVar9 + fVar9) * fVar15 * a->alpha) / a->active_c0) / a->beta_scale;
  if (in_dis) {
    fVar15 = fVar10;
    if (fVar10 <= 0.0) {
      fVar15 = 0.0;
    }
    local_98 = 0.0;
    uVar8 = -(uint)(0.0 < fVar17);
    fVar17 = (float)(-(uint)((float)(~uVar8 & 0xbf800000 | uVar8 & 0x3f800000) !=
                            (float)(~-(uint)(0.0 < prediction) & 0xbf800000 |
                                   -(uint)(0.0 < prediction) & 0x3f800000)) & 0x3f800000) *
             fVar15 * fVar9;
  }
  else {
    local_98 = -fVar9;
    fVar17 = 0.0;
  }
  fVar15 = (ec->l).simple.label;
  fVar11 = ec->weight;
  if (a->cover_size != 0) {
    local_a4 = local_a4 * 4.0 * local_a4;
    if (fVar10 <= 0.0) {
      fVar10 = 0.0;
    }
    fVar16 = *(float *)(&DAT_0027a638 + (ulong)(0.0 < prediction) * 4);
    uVar6 = 0;
    do {
      if (in_dis) {
        fVar12 = SQRT(local_a4);
        fVar13 = fVar12;
        if (local_a4 < 0.0) {
          fVar13 = sqrtf(local_a4);
          fVar12 = sqrtf(local_a4);
        }
        fVar4 = a->alpha;
        local_98 = ((fVar17 + fVar17) - fVar10 * fVar9) -
                   ((fVar4 + fVar4) * fVar4 + -1.0 / (fVar13 / (fVar12 + 1.0)));
      }
      (ec->l).multi.label =
           ~-(uint)(0.0 < local_98) & (uint)fVar16 | -(uint)(0.0 < local_98) & (uint)-fVar16;
      ec->weight = ABS(local_98) * fVar3;
      uVar2 = uVar6 + 1;
      iVar7 = (int)uVar2;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar5 = (ec->super_example_predict).ft_offset - (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      (ec->super_example_predict).ft_offset = uVar5;
      (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar7) + uVar5;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar7);
      uVar8 = -(uint)(0.0 < (ec->pred).scalar);
      fVar13 = (float)(-(uint)((float)(~uVar8 & 0xbf800000 | uVar8 & 0x3f800000) != fVar16) &
                      0x3f800000);
      a->lambda_n[uVar6] = (fVar13 + fVar13) * local_98 + a->lambda_n[uVar6];
      fVar13 = a->lambda_n[uVar6];
      if (fVar13 <= 0.0) {
        fVar13 = 0.0;
      }
      a->lambda_n[uVar6] = fVar13;
      uVar8 = -(uint)(0.0 < (ec->pred).scalar);
      dVar14 = pow((double)local_a4,1.5);
      a->lambda_d[uVar6] =
           (float)((float)(~uVar8 & 0xbf800000 | uVar8 & 0x3f800000) != fVar16 && in_dis) /
           (float)dVar14 + a->lambda_d[uVar6];
      uVar8 = -(uint)(0.0 < (ec->pred).scalar);
      local_a4 = local_a4 +
                 (a->lambda_n[uVar6] / a->lambda_d[uVar6]) *
                 (float)(-(uint)((float)(~uVar8 & 0xbf800000 | uVar8 & 0x3f800000) != fVar16) &
                        0x3f800000);
      uVar6 = uVar2;
    } while (uVar2 < a->cover_size);
  }
  ec->weight = fVar11;
  (ec->l).simple.label = fVar15;
  (ec->pred).scalar = prediction;
  return;
}

Assistant:

void predict_or_learn_active_cover(active_cover& a, single_learner& base, example& ec)
{
  base.predict(ec, 0);

  if (is_learn)
  {
    vw& all = *a.all;

    float prediction = ec.pred.scalar;
    float t = (float)a.all->sd->t;
    float ec_input_weight = ec.weight;
    float ec_input_label = ec.l.simple.label;

    // Compute threshold defining allowed set A
    float threshold = get_threshold((float)all.sd->sum_loss, t, a.active_c0, a.alpha);
    bool in_dis = dis_test(all, ec, base, prediction, threshold);
    float pmin = get_pmin((float)all.sd->sum_loss, t);
    float importance = query_decision(a, base, ec, prediction, pmin, in_dis);

    // Query (or not)
    if (!in_dis)  // Use predicted label
    {
      ec.l.simple.label = sign(prediction);
      ec.weight = ec_input_weight;
      base.learn(ec, 0);
    }
    else if (importance > 0)  // Use importance-weighted example
    {
      all.sd->queries += 1;
      ec.weight = ec_input_weight * importance;
      ec.l.simple.label = ec_input_label;
      base.learn(ec, 0);
    }
    else  // skipped example
    {
      // Make sure the loss computation does not include
      // skipped examples
      ec.l.simple.label = FLT_MAX;
      ec.weight = 0;
    }

    // Update the learners in the cover and their weights
    float q2 = 4.f * pmin * pmin;
    float p, s, cost, cost_delta = 0;
    float ec_output_label = ec.l.simple.label;
    float ec_output_weight = ec.weight;
    float r = 2.f * threshold * t * a.alpha / a.active_c0 / a.beta_scale;

    // Set up costs
    // cost = cost of predicting erm's prediction
    // cost_delta = cost - cost of predicting the opposite label
    if (in_dis)
    {
      cost = r * (fmax(importance, 0.f)) * ((float)(sign(prediction) != sign(ec_input_label)));
    }
    else
    {
      cost = 0.f;
      cost_delta = -r;
    }

    for (size_t i = 0; i < a.cover_size; i++)
    {
      // Update cost
      if (in_dis)
      {
        p = sqrt(q2) / (1.f + sqrt(q2));
        s = 2.f * a.alpha * a.alpha - 1.f / p;
        cost_delta = 2.f * cost - r * (fmax(importance, 0.f)) - s;
      }

      // Choose min-cost label as the label
      // Set importance weight to be the cost difference
      ec.l.simple.label = -1.f * sign(cost_delta) * sign(prediction);
      ec.weight = ec_input_weight * fabs(cost_delta);

      // Update learner
      base.learn(ec, i + 1);
      base.predict(ec, i + 1);

      // Update numerator of lambda
      a.lambda_n[i] += 2.f * ((float)(sign(ec.pred.scalar) != sign(prediction))) * cost_delta;
      a.lambda_n[i] = fmax(a.lambda_n[i], 0.f);

      // Update denominator of lambda
      a.lambda_d[i] += ((float)(sign(ec.pred.scalar) != sign(prediction) && in_dis)) / (float)pow(q2, 1.5);

      // Accumulating weights of learners in the cover
      q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
    }

    // Restoring the weight, the label, and the prediction
    ec.weight = ec_output_weight;
    ec.l.simple.label = ec_output_label;
    ec.pred.scalar = prediction;
  }
}